

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O1

TValue * lj_meta_arith(lua_State *L,TValue *ra,cTValue *rb,cTValue *rc,BCReg op)

{
  ushort uVar1;
  StrScanFmt SVar2;
  cTValue *pcVar3;
  TValue *pTVar4;
  ulong uVar5;
  TValue *o;
  MMS mm;
  uint64_t uVar6;
  TValue tempb;
  TValue tempc;
  TValue local_40;
  TValue local_38;
  
  uVar1 = lj_bc_mode[op];
  pTVar4 = rb;
  if (0xfffefffe < (rb->field_2).it) {
    if ((rb->field_2).it == 0xfffffffb) {
      pTVar4 = &local_40;
      SVar2 = lj_strscan_scan((uint8_t *)((ulong)(rb->u32).lo + 0x10),pTVar4,2);
      if (SVar2 != STRSCAN_ERROR) goto LAB_0010c89e;
    }
    pTVar4 = (TValue *)0x0;
  }
LAB_0010c89e:
  mm = (MMS)(uVar1 >> 0xb);
  if (pTVar4 == (TValue *)0x0) goto LAB_0010c8ff;
  o = rc;
  if (0xfffefffe < (rc->field_2).it) {
    if ((rc->field_2).it == 0xfffffffb) {
      o = &local_38;
      SVar2 = lj_strscan_scan((uint8_t *)((ulong)(rc->u32).lo + 0x10),o,2);
      if (SVar2 != STRSCAN_ERROR) goto LAB_0010c8da;
    }
    o = (TValue *)0x0;
  }
LAB_0010c8da:
  if (o != (TValue *)0x0) {
    uVar6 = lj_vm_foldarith(pTVar4->u64,o->u64,mm - MM_add);
    ra->u64 = uVar6;
    return (TValue *)0x0;
  }
LAB_0010c8ff:
  pcVar3 = lj_meta_lookup(L,rb,mm);
  if (((pcVar3->field_2).it == 0xffffffff) &&
     (pcVar3 = lj_meta_lookup(L,rc,mm), (pcVar3->field_2).it == 0xffffffff)) {
    pcVar3 = str2num(rb,&local_40);
    if (pcVar3 == (cTValue *)0x0) {
      rc = rb;
    }
    lj_err_optype(L,rc,LJ_ERR_OPARITH);
  }
  uVar5 = (ulong)L->base[-1].u32.lo;
  if (*(char *)(uVar5 + 6) == '\0') {
    pTVar4 = L->base + *(byte *)((ulong)*(uint *)(uVar5 + 0x10) - 0x39);
  }
  else {
    pTVar4 = L->top;
  }
  pTVar4->n = 3.57999966976567e-320;
  pTVar4[1] = *pcVar3;
  pTVar4[2] = *rb;
  pTVar4[3] = *rc;
  return pTVar4 + 2;
}

Assistant:

TValue *lj_meta_arith(lua_State *L, TValue *ra, cTValue *rb, cTValue *rc,
		      BCReg op)
{
  MMS mm = bcmode_mm(op);
  TValue tempb, tempc;
  cTValue *b, *c;
  if ((b = str2num(rb, &tempb)) != NULL &&
      (c = str2num(rc, &tempc)) != NULL) {  /* Try coercion first. */
    setnumV(ra, lj_vm_foldarith(numV(b), numV(c), (int)mm-MM_add));
    return NULL;
  } else {
    cTValue *mo = lj_meta_lookup(L, rb, mm);
    if (tvisnil(mo)) {
      mo = lj_meta_lookup(L, rc, mm);
      if (tvisnil(mo)) {
	if (str2num(rb, &tempb) == NULL) rc = rb;
	lj_err_optype(L, rc, LJ_ERR_OPARITH);
	return NULL;  /* unreachable */
      }
    }
    return mmcall(L, lj_cont_ra, mo, rb, rc);
  }
}